

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O0

void __thiscall
Object_ValueAlignment_Test<wchar_t>::TestBody(Object_ValueAlignment_Test<wchar_t> *this)

{
  allocator<pstore::dump::object::member> *this_00;
  initializer_list<pstore::dump::object::member> __l;
  bool bVar1;
  char *message;
  member *__n;
  void *__buf;
  member *local_210;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> expected;
  __string_type actual;
  shared_ptr<pstore::dump::number_long> local_168;
  shared_ptr<pstore::dump::value> local_158;
  allocator local_141;
  string local_140;
  shared_ptr<pstore::dump::number_long> local_120;
  shared_ptr<pstore::dump::value> local_110 [2];
  allocator local_e9;
  string local_e8;
  member *local_c8;
  member local_c0;
  member local_90;
  iterator local_60;
  size_type local_58;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_50;
  undefined1 local_38 [8];
  object v;
  Object_ValueAlignment_Test<wchar_t> *this_local;
  
  actual.field_2._M_local_buf[3]._3_1_ = 1;
  local_c8 = &local_c0;
  v._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"short",&local_e9);
  pstore::dump::make_number((int)&local_120);
  std::shared_ptr<pstore::dump::value>::shared_ptr<pstore::dump::number_long,void>
            (local_110,&local_120);
  pstore::dump::object::member::member(&local_c0,&local_e8,local_110);
  local_c8 = &local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"much_longer",&local_141);
  pstore::dump::make_number((int)&local_168);
  std::shared_ptr<pstore::dump::value>::shared_ptr<pstore::dump::number_long,void>
            (&local_158,&local_168);
  pstore::dump::object::member::member(&local_90,&local_140,&local_158);
  actual.field_2._M_local_buf[3]._3_1_ = 0;
  local_60 = &local_c0;
  local_58 = 2;
  this_00 = (allocator<pstore::dump::object::member> *)((long)&actual.field_2 + 0xe);
  std::allocator<pstore::dump::object::member>::allocator(this_00);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_50,__l,this_00);
  pstore::dump::object::object((object *)local_38,&local_50);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_50);
  std::allocator<pstore::dump::object::member>::~allocator
            ((allocator<pstore::dump::object::member> *)((long)&actual.field_2 + 0xe));
  __n = &local_c0;
  local_210 = (member *)&local_60;
  do {
    local_210 = local_210 + -1;
    pstore::dump::object::member::~member(local_210);
  } while (local_210 != __n);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_158);
  std::shared_ptr<pstore::dump::number_long>::~shared_ptr(&local_168);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(local_110);
  std::shared_ptr<pstore::dump::number_long>::~shared_ptr(&local_120);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  pstore::dump::value::write((value *)local_38,(int)this + 0x10,__buf,(size_t)__n);
  std::__cxx11::wostringstream::str();
  convert<wchar_t>((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &gtest_ar.message_,"short       : 0x2a\nmuch_longer : 0x2b");
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_nullptr>
            ((EqHelper *)local_1c0,"expected","actual",
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             &gtest_ar.message_,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_object.cpp"
               ,0x83,message);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar.message_);
  std::__cxx11::wstring::~wstring((wstring *)((long)&expected.field_2 + 8));
  pstore::dump::object::~object((object *)local_38);
  return;
}

Assistant:

TYPED_TEST (Object, ValueAlignment) {
    using namespace ::pstore::dump;
    object v{{
        {"short", make_number (42)},
        {"much_longer", make_number (43)},
    }};
    v.write (this->out);
    auto const actual = this->out.str ();
    auto const expected = convert<TypeParam> ("short       : 0x2a\n"
                                              "much_longer : 0x2b");
    EXPECT_EQ (expected, actual);
}